

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[14],std::__cxx11::string_const&,char,std::__cxx11::string&,char_const(&)[7]>
                   (string *__return_storage_ptr__,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *a,char *b,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
                   char (*args_1) [14],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
                   char *args_3,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4,
                   char (*args_5) [7])

{
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum local_2b0;
  cmAlphaNum local_278;
  cmAlphaNum local_240;
  cmAlphaNum local_208;
  cmAlphaNum local_1d0;
  cmAlphaNum local_198;
  cmAlphaNum local_160;
  cmAlphaNum local_128;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_f0;
  string_view local_d8;
  string *local_c8;
  string_view local_c0;
  string *local_b0;
  string_view local_a8;
  string *local_98;
  string_view local_90;
  string *local_80;
  string_view local_78;
  string *local_68;
  string_view local_60;
  string *local_50;
  string_view local_48;
  string *local_38;
  
  local_128.RValueString_ = (string *)0x0;
  local_128.View_._M_str = (a->_M_dataplus)._M_p;
  local_128.View_._M_len = a->_M_string_length;
  local_f0.first = cmAlphaNum::View(&local_128);
  local_f0.second = local_128.RValueString_;
  local_278.Digits_[0] = *b;
  local_278.View_._M_str = local_278.Digits_;
  local_278.RValueString_ = (string *)0x0;
  local_278.View_._M_len = 1;
  local_d8 = cmAlphaNum::View(&local_278);
  local_c8 = local_278.RValueString_;
  local_160.RValueString_ = (string *)0x0;
  local_160.View_._M_str = (args->_M_dataplus)._M_p;
  local_160.View_._M_len = args->_M_string_length;
  local_c0 = cmAlphaNum::View(&local_160);
  local_b0 = local_160.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_198,*args_1);
  local_a8 = cmAlphaNum::View(&local_198);
  local_98 = local_198.RValueString_;
  local_1d0.RValueString_ = (string *)0x0;
  local_1d0.View_._M_str = (args_2->_M_dataplus)._M_p;
  local_1d0.View_._M_len = args_2->_M_string_length;
  local_90 = cmAlphaNum::View(&local_1d0);
  local_80 = local_1d0.RValueString_;
  local_2b0.Digits_[0] = *args_3;
  local_2b0.View_._M_str = local_2b0.Digits_;
  local_2b0.RValueString_ = (string *)0x0;
  local_2b0.View_._M_len = 1;
  local_78 = cmAlphaNum::View(&local_2b0);
  local_68 = local_2b0.RValueString_;
  local_208.RValueString_ = (string *)0x0;
  local_208.View_._M_str = (args_4->_M_dataplus)._M_p;
  local_208.View_._M_len = args_4->_M_string_length;
  local_60 = cmAlphaNum::View(&local_208);
  local_50 = local_208.RValueString_;
  cmAlphaNum::cmAlphaNum(&local_240,*args_5);
  local_48 = cmAlphaNum::View(&local_240);
  local_38 = local_240.RValueString_;
  views._M_len = 8;
  views._M_array = &local_f0;
  cmCatViews(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(A&& a, B&& b, AV&&... args)
{
  static auto const makePair =
    [](const cmAlphaNum& arg) -> std::pair<cm::string_view, std::string*> {
    return { arg.View(), arg.RValueString() };
  };

  return cmCatViews({ makePair(std::forward<A>(a)),
                      makePair(std::forward<B>(b)),
                      makePair(std::forward<AV>(args))... });
}